

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O2

char * __thiscall dxil_spv::CLIParser::next_string(CLIParser *this)

{
  char *pcVar1;
  code *pcVar2;
  undefined8 uVar3;
  char buffer [4096];
  
  if (this->argc != 0) {
    pcVar1 = *this->argv;
    this->argc = this->argc + -1;
    this->argv = this->argv + 1;
    return pcVar1;
  }
  pcVar2 = (code *)dxil_spv::get_thread_log_callback();
  if (pcVar2 == (code *)0x0) {
    fwrite("[ERROR]: Tried to parse string, but nothing left in arguments.\n",0x3f,1,_stderr);
    fflush(_stderr);
  }
  else {
    builtin_strncpy(buffer,"Tried to parse string, but nothing left in arguments.\n",0x37);
    uVar3 = dxil_spv::get_thread_log_callback_userdata();
    (*pcVar2)(uVar3,2,buffer);
  }
  if ((this->cbs).error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(&(this->cbs).error_handler);
  }
  exit(1);
}

Assistant:

const char *CLIParser::next_string()
{
	if (!argc)
	{
		LOGE("Tried to parse string, but nothing left in arguments.\n");
		if (cbs.error_handler)
			cbs.error_handler();
		exit(EXIT_FAILURE);
	}

	const char *ret = *argv;
	argc--;
	argv++;
	return ret;
}